

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall
QTabBarPrivate::initBasicStyleOption(QTabBarPrivate *this,QStyleOptionTab *option,int tabIndex)

{
  byte *pbVar1;
  State *pSVar2;
  int iVar3;
  int iVar4;
  Tab *pTVar5;
  QWidgetData *pQVar6;
  bool bVar7;
  ColorRole CVar8;
  QSize QVar9;
  QTabWidget *this_00;
  QWidget *pQVar10;
  TabPosition TVar11;
  QSize QVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QRect QVar14;
  QBrush local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (int)(this->tabList).d.size;
  if (iVar3 <= tabIndex || (tabIndex < 0 || option == (QStyleOptionTab *)0x0)) goto LAB_0049166f;
  pQVar10 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pTVar5 = (this->tabList).d.ptr[(uint)tabIndex];
  QStyleOption::initFrom(&option->super_QStyleOption,pQVar10);
  pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                           super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                           super_QFlagsStorage<QStyle::StateFlag>.i + 1);
  *pbVar1 = *pbVar1 & 0xde;
  QVar14 = QTabBar::tabRect((QTabBar *)pQVar10,tabIndex);
  (option->super_QStyleOption).rect = QVar14;
  iVar4 = this->currentIndex;
  option->row = 0;
  if (this->pressedIndex == tabIndex) {
    pSVar2 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 4;
  }
  if (iVar4 == tabIndex) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 0x80;
    bVar7 = QWidget::hasFocus(pQVar10);
    if (bVar7) {
      pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  if ((pTVar5->field_0xe4 & 1) == 0) {
    pSVar2 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i & 0xfe;
  }
  bVar7 = QWidget::isActiveWindow(pQVar10);
  if (bVar7) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  if (((((this->field_0x2d1 & 2) == 0) &&
       ((option->super_QStyleOption).rect.x1.m_i ==
        *(int *)&(this->super_QWidgetPrivate).field_0x254)) &&
      ((option->super_QStyleOption).rect.x2.m_i == *(int *)&this->field_0x25c)) &&
     (((option->super_QStyleOption).rect.y1.m_i == *(int *)&this->field_0x258 &&
      ((option->super_QStyleOption).rect.y2.m_i == *(int *)&this->field_0x260)))) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  option->shape = this->shape;
  QString::operator=(&option->text,(QString *)pTVar5);
  if ((pTVar5->textColor).cspec != Invalid) {
    CVar8 = QWidget::foregroundRole(pQVar10);
    QBrush::QBrush(local_40,&pTVar5->textColor,SolidPattern);
    QPalette::setBrush((int)option + 0x28,Mid,(QBrush *)(ulong)CVar8);
    QBrush::~QBrush(local_40);
  }
  QIcon::operator=(&option->icon,&pTVar5->icon);
  QVar9 = QTabBar::iconSize((QTabBar *)pQVar10);
  option->iconSize = QVar9;
  QVar9.wd.m_i = -1;
  QVar9.ht.m_i = -1;
  QVar12.wd.m_i = -1;
  QVar12.ht.m_i = -1;
  if (pTVar5->leftWidget != (QWidget *)0x0) {
    pQVar6 = pTVar5->leftWidget->data;
    QVar12.wd.m_i = ((pQVar6->crect).x2.m_i - (pQVar6->crect).x1.m_i) + 1;
    QVar12.ht.m_i = ((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + 1;
  }
  option->leftButtonSize = QVar12;
  if (pTVar5->rightWidget != (QWidget *)0x0) {
    pQVar6 = pTVar5->rightWidget->data;
    QVar9.wd.m_i = ((pQVar6->crect).x2.m_i - (pQVar6->crect).x1.m_i) + 1;
    QVar9.ht.m_i = ((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + 1;
  }
  option->rightButtonSize = QVar9;
  option->documentMode = (bool)((byte)((ushort)*(undefined2 *)&this->field_0x2d0 >> 10) & 1);
  if ((tabIndex < 1) || (tabIndex + -1 != this->currentIndex)) {
    if ((tabIndex + 1 < iVar3) && (tabIndex + 1 == this->currentIndex)) {
      option->selectedPosition = NextIsSelected;
    }
    else {
      option->selectedPosition = NotAdjacent;
    }
  }
  else {
    option->selectedPosition = PreviousIsSelected;
  }
  bVar13 = true;
  bVar7 = true;
  if (this->firstVisible != tabIndex) {
    if ((this->field_0x2d1 & 2) == 0) {
      bVar7 = false;
    }
    else {
      bVar7 = this->pressedIndex + 1 == tabIndex;
    }
  }
  if (this->lastVisible != tabIndex) {
    if ((this->field_0x2d1 & 2) == 0) {
      bVar13 = false;
    }
    else {
      bVar13 = this->pressedIndex + -1 == tabIndex;
    }
  }
  TVar11 = bVar13 + Middle;
  if (bVar7) {
    TVar11 = (uint)bVar13 + (uint)bVar13 * 2;
  }
  option->position = TVar11;
  this_00 = (QTabWidget *)QMetaObject::cast((QObject *)&QTabWidget::staticMetaObject);
  if (this_00 != (QTabWidget *)0x0) {
    *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
              super_QFlagsStorage<QStyleOptionTab::TabFeature>.i =
         (byte)(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
               super_QFlagsStorage<QStyleOptionTab::TabFeature>.i | 1;
    pQVar10 = QTabWidget::cornerWidget(this_00,TopLeftCorner);
    if (pQVar10 == (QWidget *)0x0) {
      pQVar10 = QTabWidget::cornerWidget(this_00,BottomLeftCorner);
      if (pQVar10 != (QWidget *)0x0) goto LAB_00491625;
    }
    else {
LAB_00491625:
      *(byte *)&(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>.
                super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i =
           (byte)(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>
                 .super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i | 1;
    }
    pQVar10 = QTabWidget::cornerWidget(this_00,TopRightCorner);
    if (pQVar10 == (QWidget *)0x0) {
      pQVar10 = QTabWidget::cornerWidget(this_00,BottomRightCorner);
      if (pQVar10 == (QWidget *)0x0) goto LAB_00491653;
    }
    *(byte *)&(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>.
              super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i =
         (byte)(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>.
               super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i | 2;
  }
LAB_00491653:
  if ((pTVar5->field_0xe4 & 4) != 0) {
    *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
              super_QFlagsStorage<QStyleOptionTab::TabFeature>.i =
         (byte)(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
               super_QFlagsStorage<QStyleOptionTab::TabFeature>.i | 2;
  }
  option->tabIndex = tabIndex;
LAB_0049166f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::initBasicStyleOption(QStyleOptionTab *option, int tabIndex) const
{
    Q_Q(const QTabBar);
    const int totalTabs = tabList.size();

    if (!option || (tabIndex < 0 || tabIndex >= totalTabs))
        return;

    const QTabBarPrivate::Tab &tab = *tabList.at(tabIndex);
    option->initFrom(q);
    option->state &= ~(QStyle::State_HasFocus | QStyle::State_MouseOver);
    option->rect = q->tabRect(tabIndex);
    const bool isCurrent = tabIndex == currentIndex;
    option->row = 0;
    if (tabIndex == pressedIndex)
        option->state |= QStyle::State_Sunken;
    if (isCurrent)
        option->state |= QStyle::State_Selected;
    if (isCurrent && q->hasFocus())
        option->state |= QStyle::State_HasFocus;
    if (!tab.enabled)
        option->state &= ~QStyle::State_Enabled;
    if (q->isActiveWindow())
        option->state |= QStyle::State_Active;
    if (!dragInProgress && option->rect == hoverRect)
        option->state |= QStyle::State_MouseOver;
    option->shape = shape;
    option->text = tab.text;

    if (tab.textColor.isValid())
        option->palette.setColor(q->foregroundRole(), tab.textColor);
    option->icon = tab.icon;
    option->iconSize = q->iconSize();  // Will get the default value then.

    option->leftButtonSize = tab.leftWidget ? tab.leftWidget->size() : QSize();
    option->rightButtonSize = tab.rightWidget ? tab.rightWidget->size() : QSize();
    option->documentMode = documentMode;

    if (tabIndex > 0 && tabIndex - 1 == currentIndex)
        option->selectedPosition = QStyleOptionTab::PreviousIsSelected;
    else if (tabIndex + 1 < totalTabs && tabIndex + 1 == currentIndex)
        option->selectedPosition = QStyleOptionTab::NextIsSelected;
    else
        option->selectedPosition = QStyleOptionTab::NotAdjacent;

    const bool paintBeginning = (tabIndex == firstVisible) || (dragInProgress && tabIndex == pressedIndex + 1);
    const bool paintEnd = (tabIndex == lastVisible) || (dragInProgress && tabIndex == pressedIndex - 1);
    if (paintBeginning) {
        if (paintEnd)
            option->position = QStyleOptionTab::OnlyOneTab;
        else
            option->position = QStyleOptionTab::Beginning;
    } else if (paintEnd) {
        option->position = QStyleOptionTab::End;
    } else {
        option->position = QStyleOptionTab::Middle;
    }

#if QT_CONFIG(tabwidget)
    if (const QTabWidget *tw = qobject_cast<const QTabWidget *>(q->parentWidget())) {
        option->features |= QStyleOptionTab::HasFrame;
        if (tw->cornerWidget(Qt::TopLeftCorner) || tw->cornerWidget(Qt::BottomLeftCorner))
            option->cornerWidgets |= QStyleOptionTab::LeftCornerWidget;
        if (tw->cornerWidget(Qt::TopRightCorner) || tw->cornerWidget(Qt::BottomRightCorner))
            option->cornerWidgets |= QStyleOptionTab::RightCornerWidget;
    }
#endif
    if (tab.measuringMinimum)
        option->features |= QStyleOptionTab::MinimumSizeHint;
    option->tabIndex = tabIndex;
}